

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

TempVar * __thiscall
wasm::I64ToI32Lowering::fetchOutParam
          (TempVar *__return_storage_ptr__,I64ToI32Lowering *this,Expression *e)

{
  iterator iVar1;
  Expression *local_20;
  Expression *e_local;
  
  local_20 = e;
  iVar1 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->highBitVars)._M_h,&local_20);
  if (iVar1.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
      ._M_cur != (__node_type *)0x0) {
    TempVar::TempVar(__return_storage_ptr__,
                     (TempVar *)
                     ((long)iVar1.
                            super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
                            ._M_cur + 0x10));
    std::
    _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->highBitVars)._M_h,&local_20);
    return __return_storage_ptr__;
  }
  __assert_fail("outParamIt != highBitVars.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x668,"TempVar wasm::I64ToI32Lowering::fetchOutParam(Expression *)");
}

Assistant:

TempVar fetchOutParam(Expression* e) {
    auto outParamIt = highBitVars.find(e);
    assert(outParamIt != highBitVars.end());
    TempVar ret = std::move(outParamIt->second);
    highBitVars.erase(e);
    return ret;
  }